

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O2

void __thiscall
Lodtalk::StackPage::StackPage(StackPage *this,VMContext *context,uint8_t *memoryLocation)

{
  this->context = context;
  this->stackPageSize = 0x2000;
  this->stackPageLowest = memoryLocation;
  this->stackPageHighest = memoryLocation + 0x2000;
  this->baseFramePointer = (uint8_t *)0x0;
  this->overflowLimit = memoryLocation + 0x2e8;
  this->stackLimit = memoryLocation + 0x2e8;
  (this->headFrame).framePointer = (uint8_t *)0x0;
  (this->headFrame).stackPointer = (uint8_t *)0x0;
  this->previousPage = (StackPage *)0x0;
  this->nextPage = (StackPage *)0x0;
  return;
}

Assistant:

StackPage::StackPage(VMContext *context, uint8_t *memoryLocation)
    : context(context)
{
    stackPageSize = StackMemoryPageSize;

    stackPageLowest = memoryLocation;
    stackPageHighest = stackPageLowest + stackPageSize;
    baseFramePointer = nullptr;

    overflowLimit = stackPageLowest + Context::LargeContextSlots*sizeof(void*)*3/2;
    stackLimit = overflowLimit;

    headFrame = StackFrame(nullptr, nullptr);
    previousPage = nullptr;
    nextPage = nullptr;
}